

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImDrawListFlags IVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ImDrawList *pIVar5;
  ImDrawCmd *pIVar6;
  ImDrawVert *p;
  ImVector<unsigned_short> *lhs;
  char *local_2d0;
  uint local_2ac;
  ImVec2 *local_298;
  uint local_28c;
  long local_278;
  char *local_250;
  ImDrawListFlags backup_flags;
  ImDrawVert *local_228;
  ImDrawVert *v;
  int vtx_i;
  int n;
  ImVec2 triangles_pos [3];
  char *buf_end;
  char *buf_p;
  int local_1e8;
  int idx_i;
  int prim;
  undefined1 local_1d8 [8];
  ImGuiListClipper clipper;
  int i;
  ImRect vtxs_rect;
  ImRect clip_rect;
  bool pcmd_node_open;
  char buf [300];
  ImDrawIdx *idx_buffer;
  ImDrawCmd *pcmd;
  ImVec2 IStack_48;
  int elem_offset;
  ImDrawList *local_40;
  ImDrawList *fg_draw_list;
  byte local_21;
  char *pcStack_20;
  bool node_open;
  char *label_local;
  ImDrawList *draw_list_local;
  ImGuiWindow *window_local;
  
  if (draw_list->_OwnerName == (char *)0x0) {
    local_250 = "";
  }
  else {
    local_250 = draw_list->_OwnerName;
  }
  pcStack_20 = label;
  label_local = (char *)draw_list;
  draw_list_local = (ImDrawList *)window;
  local_21 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,local_250,
                      (ulong)(uint)(draw_list->VtxBuffer).Size,
                      (ulong)(uint)(draw_list->IdxBuffer).Size,(draw_list->CmdBuffer).Size);
  pcVar2 = label_local;
  pIVar5 = GetWindowDrawList();
  if ((ImDrawList *)pcVar2 == pIVar5) {
    SameLine(0.0,-1.0);
    ImVec4::ImVec4((ImVec4 *)((long)&fg_draw_list + 4),1.0,0.4,0.4,1.0);
    TextColored((ImVec4 *)((long)&fg_draw_list + 4),"CURRENTLY APPENDING");
    if ((local_21 & 1) != 0) {
      TreePop();
    }
  }
  else {
    local_40 = GetForegroundDrawList((ImGuiWindow *)draw_list_local);
    if ((draw_list_local != (ImDrawList *)0x0) &&
       (bVar3 = IsItemHovered(0), pIVar5 = local_40, bVar3)) {
      lhs = &draw_list_local->IdxBuffer;
      IStack_48 = operator+((ImVec2 *)lhs,(ImVec2 *)&(draw_list_local->IdxBuffer).Data);
      ImDrawList::AddRect(pIVar5,(ImVec2 *)lhs,&stack0xffffffffffffffb8,0xff00ffff,0.0,0xf,1.0);
    }
    if ((local_21 & 1) != 0) {
      if ((draw_list_local != (ImDrawList *)0x0) &&
         (((ulong)(draw_list_local->_TextureIdStack).Data & 0x100000000000000) == 0)) {
        Text("(Note: owning Window is inactive: DrawList is not being rendered!)");
      }
      pcmd._4_4_ = 0;
      for (idx_buffer = (ImDrawIdx *)ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
          pIVar6 = ImVector<ImDrawCmd>::end((ImVector<ImDrawCmd> *)label_local), idx_buffer < pIVar6
          ; idx_buffer = idx_buffer + 0x1c) {
        if ((*(long *)(idx_buffer + 0x14) != 0) || (*(int *)idx_buffer != 0)) {
          if (*(long *)(idx_buffer + 0x14) == 0) {
            if (*(int *)(label_local + 0x10) < 1) {
              local_278 = 0;
            }
            else {
              local_278 = *(long *)(label_local + 0x18);
            }
            ImFormatString((char *)&clip_rect.Max.y,300,
                           "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           (double)*(float *)(idx_buffer + 2),(double)*(float *)(idx_buffer + 4),
                           (double)*(float *)(idx_buffer + 6),(double)*(float *)(idx_buffer + 8),
                           (ulong)*(uint *)idx_buffer / 3,*(undefined8 *)(idx_buffer + 0xc));
            pIVar6 = ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
            clip_rect.Max.x._3_1_ =
                 TreeNode((void *)(((long)idx_buffer - (long)pIVar6) / 0x38),"%s",&clip_rect.Max.y);
            if ((((show_drawcmd_clip_rects & 1U) != 0) && (local_40 != (ImDrawList *)0x0)) &&
               (bVar3 = IsItemHovered(0), bVar3)) {
              ImRect::ImRect((ImRect *)&vtxs_rect.Max,(ImVec4 *)(idx_buffer + 2));
              ImRect::ImRect((ImRect *)&clipper.DisplayEnd);
              for (clipper.DisplayStart = pcmd._4_4_;
                  clipper.DisplayStart < pcmd._4_4_ + *(int *)idx_buffer;
                  clipper.DisplayStart = clipper.DisplayStart + 1) {
                if (local_278 == 0) {
                  local_28c = clipper.DisplayStart;
                }
                else {
                  local_28c = (uint)*(ushort *)(local_278 + (long)clipper.DisplayStart * 2);
                }
                p = ImVector<ImDrawVert>::operator[]
                              ((ImVector<ImDrawVert> *)(label_local + 0x20),local_28c);
                ImRect::Add((ImRect *)&clipper.DisplayEnd,&p->pos);
              }
              ImRect::Floor((ImRect *)&vtxs_rect.Max);
              ImDrawList::AddRect(local_40,&vtxs_rect.Max,&clip_rect.Min,0xffff00ff,0.0,0xf,1.0);
              ImRect::Floor((ImRect *)&clipper.DisplayEnd);
              ImDrawList::AddRect(local_40,(ImVec2 *)&clipper.DisplayEnd,&vtxs_rect.Min,0xff00ffff,
                                  0.0,0xf,1.0);
            }
            if ((clip_rect.Max.x._3_1_ & 1) != 0) {
              Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d",
                   (ulong)*(uint *)idx_buffer,(ulong)*(uint *)idx_buffer / 3,
                   (ulong)*(uint *)(idx_buffer + 0x10),(ulong)*(uint *)(idx_buffer + 0x12));
              ImGuiListClipper::ImGuiListClipper
                        ((ImGuiListClipper *)local_1d8,*(uint *)idx_buffer / 3,-1.0);
              while (bVar3 = ImGuiListClipper::Step((ImGuiListClipper *)local_1d8), bVar3) {
                buf_p._4_4_ = pcmd._4_4_ + clipper.ItemsCount * 3;
                for (local_1e8 = clipper.ItemsCount; local_1e8 < clipper.StepNo;
                    local_1e8 = local_1e8 + 1) {
                  buf_end = (char *)&clip_rect.Max.y;
                  triangles_pos[2] = (ImVec2)((long)buf + 0x124);
                  local_298 = (ImVec2 *)&vtx_i;
                  do {
                    ImVec2::ImVec2(local_298);
                    local_298 = local_298 + 1;
                  } while (local_298 != triangles_pos + 2);
                  for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
                    if (local_278 == 0) {
                      local_2ac = buf_p._4_4_;
                    }
                    else {
                      local_2ac = (uint)*(ushort *)(local_278 + (long)(int)buf_p._4_4_ * 2);
                    }
                    v._0_4_ = local_2ac;
                    local_228 = ImVector<ImDrawVert>::operator[]
                                          ((ImVector<ImDrawVert> *)(label_local + 0x20),local_2ac);
                    *(ImVec2 *)(&vtx_i + (long)v._4_4_ * 2) = local_228->pos;
                    if (v._4_4_ == 0) {
                      local_2d0 = "elem";
                    }
                    else {
                      local_2d0 = "    ";
                    }
                    iVar4 = ImFormatString(buf_end,(long)triangles_pos[2] - (long)buf_end,
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           (double)(local_228->pos).x,(double)(local_228->pos).y,
                                           (double)(local_228->uv).x,(double)(local_228->uv).y,
                                           local_2d0,(ulong)buf_p._4_4_,(ulong)local_228->col);
                    buf_end = buf_end + iVar4;
                    buf_p._4_4_ = buf_p._4_4_ + 1;
                  }
                  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffdd0,0.0,0.0);
                  Selectable((char *)&clip_rect.Max.y,false,0,(ImVec2 *)&stack0xfffffffffffffdd0);
                  if ((local_40 != (ImDrawList *)0x0) && (bVar3 = IsItemHovered(0), bVar3)) {
                    IVar1 = local_40->Flags;
                    local_40->Flags = local_40->Flags & 0xfffffffe;
                    ImDrawList::AddPolyline(local_40,(ImVec2 *)&vtx_i,3,0xff00ffff,true,1.0);
                    local_40->Flags = IVar1;
                  }
                }
              }
              TreePop();
              ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_1d8);
            }
          }
          else {
            BulletText("Callback %p, user_data %p",*(undefined8 *)(idx_buffer + 0x14),
                       *(undefined8 *)(idx_buffer + 0x18));
          }
        }
        pcmd._4_4_ = *(int *)idx_buffer + pcmd._4_4_;
      }
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::Text("(Note: owning Window is inactive: DrawList is not being rendered!)");

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,0,255,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGui::Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d", pcmd->ElemCount, pcmd->ElemCount/3, pcmd->VtxOffset, pcmd->IdxOffset);
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "elem" : "    ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }